

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::Seek(DBIter *this,Slice *target)

{
  pointer pcVar1;
  int iVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->direction_ = kForward;
  pcVar1 = (this->saved_value_)._M_dataplus._M_p;
  if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar1 == &(this->saved_value_).field_2) ||
     ((this->saved_value_).field_2._M_allocated_capacity < 0x100001)) {
    (this->saved_value_)._M_string_length = 0;
    *pcVar1 = '\0';
  }
  else {
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity =
         local_48.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
              (&local_48,&this->saved_value_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  local_48._M_dataplus._M_p = target->data_;
  local_48._M_string_length = target->size_;
  local_48.field_2._M_allocated_capacity = this->sequence_;
  local_48.field_2._8_4_ = 1;
  AppendInternalKey(&this->saved_key_,(ParsedInternalKey *)&local_48);
  local_48._M_dataplus._M_p = (this->saved_key_)._M_dataplus._M_p;
  local_48._M_string_length = (this->saved_key_)._M_string_length;
  (*this->iter_->_vptr_Iterator[5])();
  iVar2 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar2 == '\0') {
    this->valid_ = false;
  }
  else {
    FindNextUserEntry(this,false,&this->saved_key_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::Seek(const Slice& target) {
  direction_ = kForward;
  ClearSavedValue();
  saved_key_.clear();
  AppendInternalKey(&saved_key_,
                    ParsedInternalKey(target, sequence_, kValueTypeForSeek));
  iter_->Seek(saved_key_);
  if (iter_->Valid()) {
    FindNextUserEntry(false, &saved_key_ /* temporary storage */);
  } else {
    valid_ = false;
  }
}